

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_static_counter<double>::serialize(basic_static_counter<double> *this,string *str)

{
  double value;
  
  value = thread_local_value<double>::value(&this->default_label_value_);
  if (((value == 0.0) && (!NAN(value))) && (this->has_change_ != true)) {
    return;
  }
  metric_t::serialize_head((metric_t *)this,str);
  serialize_default_label(this,str,value);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto value = default_label_value_.value();
    if (value == 0 && !has_change_) {
      return;
    }

    metric_t::serialize_head(str);
    serialize_default_label(str, value);
  }